

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O0

void testing::internal::PrintCharAndCodeTo<wchar_t,wchar_t>(wchar_t c,ostream *os)

{
  ostream *poVar1;
  char *pcVar2;
  String *in_stack_ffffffffffffff90;
  String *this;
  String local_50 [2];
  String local_30;
  CharFormat local_1c;
  ostream *poStack_18;
  CharFormat format;
  ostream *os_local;
  wchar_t c_local;
  
  poStack_18 = os;
  os_local._4_4_ = c;
  std::operator<<(os,"L\'");
  local_1c = PrintAsCharLiteralTo<wchar_t,wchar_t>(os_local._4_4_,poStack_18);
  std::operator<<(poStack_18,"\'");
  if (os_local._4_4_ != L'\0') {
    poVar1 = std::operator<<(poStack_18," (");
    String::Format(&local_30,"%d",(ulong)(uint)os_local._4_4_);
    pcVar2 = String::c_str(&local_30);
    std::operator<<(poVar1,pcVar2);
    String::~String(in_stack_ffffffffffffff90);
    poVar1 = poStack_18;
    if ((local_1c != kHexEscape) && ((os_local._4_4_ < L'\x01' || (L'\t' < os_local._4_4_)))) {
      this = local_50;
      String::Format(this,", 0x%X",(ulong)(uint)os_local._4_4_);
      pcVar2 = String::c_str(this);
      std::operator<<(poVar1,pcVar2);
      String::~String(this);
    }
    std::operator<<(poStack_18,")");
  }
  return;
}

Assistant:

void PrintCharAndCodeTo(Char c, ostream* os) {
  // First, print c as a literal in the most readable form we can find.
  *os << ((sizeof(c) > 1) ? "L'" : "'");
  const CharFormat format = PrintAsCharLiteralTo<UnsignedChar>(c, os);
  *os << "'";

  // To aid user debugging, we also print c's code in decimal, unless
  // it's 0 (in which case c was printed as '\\0', making the code
  // obvious).
  if (c == 0)
    return;
  *os << " (" << String::Format("%d", c).c_str();

  // For more convenience, we print c's code again in hexidecimal,
  // unless c was already printed in the form '\x##' or the code is in
  // [1, 9].
  if (format == kHexEscape || (1 <= c && c <= 9)) {
    // Do nothing.
  } else {
    *os << String::Format(", 0x%X",
                          static_cast<UnsignedChar>(c)).c_str();
  }
  *os << ")";
}